

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::ReadListFileAsString(cmMakefile *this,string *content,string *virtualFileName)

{
  cmake *pcVar1;
  bool bVar2;
  bool bVar3;
  string *in_base;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *this_00;
  ListFileScope scope;
  string filenametoread;
  cmListFile listFile;
  ListFileScope LStack_88;
  string local_78;
  cmStateDirectory local_58;
  
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  cmsys::SystemTools::CollapseFullPath(&local_78,virtualFileName,in_base);
  ListFileScope::ListFileScope(&LStack_88,this,&local_78);
  local_58.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_58.DirectoryState.Position = 0;
  local_58.Snapshot_.State = (cmState *)0x0;
  bVar2 = cmListFile::ParseString
                    ((cmListFile *)&local_58,(content->_M_dataplus)._M_p,
                     (virtualFileName->_M_dataplus)._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (!bVar2) goto LAB_002828a0;
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  this_00 = (pcVar1->DebugAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (pcVar1->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (this_00 != (element_type *)0x0) {
LAB_00282843:
      bVar3 = true;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_00282853;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    if (this_00 != (element_type *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      this_00 = (pcVar1->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var4 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00282843;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      bVar3 = false;
LAB_00282853:
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (this_00,&local_78,
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
      if (!bVar3) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
  }
  RunListFile(this,(cmListFile *)&local_58,&local_78,(DeferCommands *)0x0);
  if ((cmSystemTools::s_FatalErrorOccurred != false) ||
     (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
    LStack_88.ReportError = false;
  }
LAB_002828a0:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
  ListFileScope::~ListFileScope(&LStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadListFileAsString(const std::string& content,
                                      const std::string& virtualFileName)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    virtualFileName, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseString(content.c_str(), virtualFileName.c_str(),
                            this->GetMessenger(), this->Backtrace)) {
    return false;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      filenametoread, listFile.Functions);
  }
#endif

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}